

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

void cmSystemTools::Glob(string *directory,string *regexp,
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *files)

{
  bool bVar1;
  unsigned_long uVar2;
  char *pcVar3;
  uint uVar4;
  Directory d;
  string fname;
  RegularExpression reg;
  allocator local_131;
  Directory local_130;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_128;
  value_type local_120;
  RegularExpression local_100;
  
  local_128 = files;
  cmsys::Directory::Directory(&local_130);
  cmsys::RegularExpression::RegularExpression(&local_100,(regexp->_M_dataplus)._M_p);
  bVar1 = cmsys::Directory::Load(&local_130,directory);
  if (bVar1) {
    uVar2 = cmsys::Directory::GetNumberOfFiles(&local_130);
    for (uVar4 = 0; uVar4 < uVar2; uVar4 = uVar4 + 1) {
      pcVar3 = cmsys::Directory::GetFile(&local_130,(ulong)uVar4);
      std::__cxx11::string::string((string *)&local_120,pcVar3,&local_131);
      bVar1 = cmsys::RegularExpression::find(&local_100,local_120._M_dataplus._M_p);
      if (bVar1) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(local_128,&local_120);
      }
      std::__cxx11::string::~string((string *)&local_120);
    }
  }
  cmsys::RegularExpression::~RegularExpression(&local_100);
  cmsys::Directory::~Directory(&local_130);
  return;
}

Assistant:

void cmSystemTools::Glob(const std::string& directory,
                         const std::string& regexp,
                         std::vector<std::string>& files)
{
  cmsys::Directory d;
  cmsys::RegularExpression reg(regexp.c_str());

  if (d.Load(directory))
    {
    size_t numf;
        unsigned int i;
    numf = d.GetNumberOfFiles();
    for (i = 0; i < numf; i++)
      {
      std::string fname = d.GetFile(i);
      if (reg.find(fname))
        {
        files.push_back(fname);
        }
      }
    }
}